

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O2

set<int,_std::less<int>,_std::allocator<int>_> *
getWallTags(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
           ImportedUgrid *mesh)

{
  _Rb_tree_color _Var1;
  ostream *this;
  _Base_ptr p_Var2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> all_tags;
  _Vector_base<int,_std::allocator<int>_> _Stack_48;
  
  findAllTags((vector<int,_std::allocator<int>_> *)&_Stack_48,mesh);
  tellUserTags((vector<int,_std::allocator<int>_> *)&_Stack_48);
  getUserTags();
  std::operator<<((ostream *)&std::cout,"Measuring distance to nearest tag: ");
  for (p_Var2 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    _Var1 = p_Var2[1]._M_color;
    this = std::operator<<((ostream *)&std::cout," ");
    std::ostream::operator<<(this,_Var1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_48);
  return __return_storage_ptr__;
}

Assistant:

std::set<int> getWallTags(const Parfait::ImportedUgrid& mesh){
    auto all_tags = findAllTags(mesh);
    tellUserTags(all_tags);
    auto tags = getUserTags();
    std::cout << "Measuring distance to nearest tag: ";
    for(auto t : tags){
        std::cout << " " << t;
    }
    std::cout << std::endl;
    return tags;
}